

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::bson::
basic_bson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::begin_document(basic_bson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
                 *this,json_visitor *visitor,error_code *ec)

{
  size_t *psVar1;
  uchar *puVar2;
  uchar *puVar3;
  uchar *puVar4;
  bson_errc __e;
  ulong uVar5;
  ulong uVar6;
  uint8_t buf [4];
  type_conflict4 length;
  int local_2c;
  ulong local_28;
  parse_mode local_20;
  int local_1c;
  
  if (*(int *)((this->options_)._vptr_bson_decode_options[-3] + 8 +
              (long)&(this->options_)._vptr_bson_decode_options) <
      (int)((ulong)((long)(this->state_stack_).
                          super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->state_stack_).
                         super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333) {
    __e = max_nesting_depth_exceeded;
  }
  else {
    puVar2 = (this->source_).current_._M_current;
    puVar3 = (this->source_).end_._M_current;
    uVar5 = 4;
    if ((ulong)((long)puVar3 - (long)puVar2) < 4) {
      uVar5 = (long)puVar3 - (long)puVar2;
    }
    if (puVar3 == puVar2) {
      psVar1 = &(this->source_).position_;
      *psVar1 = *psVar1 + uVar5;
    }
    else {
      uVar6 = 0;
      puVar4 = puVar2;
      do {
        (this->source_).current_._M_current = puVar4 + 1;
        *(uchar *)((long)&local_2c + uVar6) = *puVar4;
        uVar6 = uVar6 + 1;
        puVar4 = puVar4 + 1;
      } while (uVar5 != uVar6);
      psVar1 = &(this->source_).position_;
      *psVar1 = *psVar1 + uVar5;
      local_28 = uVar5;
      if (3 < (ulong)((long)puVar3 - (long)puVar2)) {
        local_1c = local_2c;
        (*visitor->_vptr_basic_json_visitor[3])(visitor,0,this);
        this->more_ = (bool)(this->cursor_mode_ ^ 1);
        local_20 = document;
        std::vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>>::
        emplace_back<jsoncons::bson::parse_mode,int&,unsigned_long&>
                  ((vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>>
                    *)&this->state_stack_,&local_20,&local_1c,&local_28);
        return;
      }
    }
    __e = unexpected_eof;
  }
  std::error_code::operator=(ec,__e);
  this->more_ = false;
  return;
}

Assistant:

void begin_document(json_visitor& visitor, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(static_cast<int>(state_stack_.size()) > options_.max_nesting_depth()))
        {
            ec = bson_errc::max_nesting_depth_exceeded;
            more_ = false;
            return;
        } 

        uint8_t buf[sizeof(int32_t)]; 
        std::size_t n = source_.read(buf, sizeof(int32_t));
        if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }

        auto length = binary::little_to_native<int32_t>(buf, sizeof(buf));

        visitor.begin_object(semantic_tag::none, *this, ec);
        more_ = !cursor_mode_;
        state_stack_.emplace_back(parse_mode::document,length,n);
    }